

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_compute_forward_dup(ggml_compute_params *params,ggml_tensor *src0,ggml_tensor *dst)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ggml_type gVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  _Bool _Var11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  int i02_2;
  ulong uVar21;
  char *pcVar22;
  int i02;
  ulong uVar23;
  int i01_2;
  ulong uVar24;
  int i01;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  size_t sVar30;
  long lVar31;
  undefined1 auVar32 [16];
  sbyte sStack_90;
  long local_50;
  
  switch(src0->type) {
  case GGML_TYPE_Q4_0:
  case GGML_TYPE_Q4_1:
  case GGML_TYPE_I8:
  case GGML_TYPE_I16:
  case GGML_TYPE_I32:
  case GGML_TYPE_COUNT:
    pcVar22 = "false";
    uVar16 = 0x1165;
    break;
  case GGML_TYPE_F16:
    if (params->ith == 0) {
      _Var11 = ggml_is_contiguous(dst);
      if (_Var11) {
        iVar19 = dst->ne[1] * dst->ne[0] * dst->ne[2] * dst->ne[3];
        uVar1 = src0->ne[0];
        uVar2 = src0->ne[1];
        uVar12 = (ulong)uVar2;
        uVar3 = src0->ne[2];
        uVar4 = src0->ne[3];
        uVar13 = (ulong)uVar4;
        if (iVar19 == uVar3 * uVar4 * uVar2 * uVar1) {
          if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
            return;
          }
          sVar6 = src0->nb[0];
          sVar7 = src0->nb[1];
          sVar8 = src0->nb[2];
          sVar9 = src0->nb[3];
          _Var11 = ggml_is_contiguous(src0);
          gVar5 = dst->type;
          if (_Var11 && gVar5 == GGML_TYPE_F16) {
            sStack_90 = 1;
LAB_00124309:
            memcpy(dst->data,src0->data,(long)iVar19 << sStack_90);
            return;
          }
          if (sVar6 == 2) {
            if (gVar5 == GGML_TYPE_F32) {
              uVar15 = 0;
              uVar27 = (ulong)uVar1;
              if ((int)uVar1 < 1) {
                uVar27 = uVar15;
              }
              if ((int)uVar2 < 1) {
                uVar12 = uVar15;
              }
              uVar14 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar14 = uVar15;
              }
              if ((int)uVar4 < 1) {
                uVar13 = uVar15;
              }
              pvVar10 = dst->data;
              iVar19 = 0;
              for (uVar17 = 0; uVar17 != uVar13; uVar17 = uVar17 + 1) {
                uVar20 = uVar15;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  uVar23 = uVar20;
                  for (uVar24 = 0; uVar24 != uVar12; uVar24 = uVar24 + 1) {
                    for (uVar26 = 0; uVar27 != uVar26; uVar26 = uVar26 + 1) {
                      *(float *)((long)pvVar10 + uVar26 * 4 + (long)iVar19 * 4) =
                           table_f32_f16[*(ushort *)((long)src0->data + uVar26 * 2 + uVar23)];
                    }
                    iVar19 = iVar19 + (int)uVar26;
                    uVar23 = uVar23 + sVar7;
                  }
                  uVar20 = uVar20 + sVar8;
                }
                uVar15 = uVar15 + sVar9;
              }
              return;
            }
            if (gVar5 == GGML_TYPE_F16) {
              sVar30 = (long)(int)uVar1 * 2;
              if ((int)uVar2 < 1) {
                uVar12 = 0;
              }
              uVar27 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar27 = 0;
              }
              local_50 = 0;
              if ((int)uVar4 < 1) {
                uVar13 = 0;
              }
              iVar19 = 0;
              for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
                lVar29 = local_50;
                for (uVar14 = 0; uVar14 != uVar27; uVar14 = uVar14 + 1) {
                  lVar18 = (long)iVar19 * sVar30;
                  lVar28 = lVar29;
                  for (lVar31 = 0; -lVar31 != uVar12; lVar31 = lVar31 + -1) {
                    memcpy((void *)((long)dst->data + lVar18),(void *)((long)src0->data + lVar28),
                           sVar30);
                    lVar18 = lVar18 + sVar30;
                    lVar28 = lVar28 + sVar7;
                  }
                  iVar19 = iVar19 - (int)lVar31;
                  lVar29 = lVar29 + sVar8;
                }
                local_50 = local_50 + sVar9;
              }
              return;
            }
            pcVar22 = "false";
            uVar16 = 0x10be;
          }
          else {
            if (gVar5 == GGML_TYPE_F16) {
              uVar15 = 0;
              uVar27 = (ulong)uVar1;
              if ((int)uVar1 < 1) {
                uVar27 = uVar15;
              }
              pvVar10 = dst->data;
              if ((int)uVar2 < 1) {
                uVar12 = uVar15;
              }
              uVar14 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar14 = uVar15;
              }
              if ((int)uVar4 < 1) {
                uVar13 = uVar15;
              }
              iVar19 = 0;
              for (uVar17 = 0; uVar17 != uVar13; uVar17 = uVar17 + 1) {
                uVar20 = uVar15;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  uVar23 = uVar20;
                  for (uVar24 = 0; uVar24 != uVar12; uVar24 = uVar24 + 1) {
                    uVar26 = uVar23;
                    for (uVar25 = 0; uVar27 != uVar25; uVar25 = uVar25 + 1) {
                      *(undefined2 *)((long)pvVar10 + uVar25 * 2 + (long)iVar19 * 2) =
                           *(undefined2 *)((long)src0->data + uVar26);
                      uVar26 = uVar26 + sVar6;
                    }
                    iVar19 = iVar19 + (int)uVar25;
                    uVar23 = uVar23 + sVar7;
                  }
                  uVar20 = uVar20 + sVar8;
                }
                uVar15 = uVar15 + sVar9;
              }
              return;
            }
            if (gVar5 == GGML_TYPE_F32) {
              uVar15 = 0;
              uVar27 = (ulong)uVar1;
              if ((int)uVar1 < 1) {
                uVar27 = uVar15;
              }
              if ((int)uVar2 < 1) {
                uVar12 = uVar15;
              }
              uVar14 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar14 = uVar15;
              }
              if ((int)uVar4 < 1) {
                uVar13 = uVar15;
              }
              pvVar10 = dst->data;
              iVar19 = 0;
              for (uVar17 = 0; uVar17 != uVar13; uVar17 = uVar17 + 1) {
                uVar20 = uVar15;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  uVar23 = uVar20;
                  for (uVar24 = 0; uVar24 != uVar12; uVar24 = uVar24 + 1) {
                    uVar26 = uVar23;
                    for (uVar25 = 0; uVar27 != uVar25; uVar25 = uVar25 + 1) {
                      *(float *)((long)pvVar10 + uVar25 * 4 + (long)iVar19 * 4) =
                           table_f32_f16[*(ushort *)((long)src0->data + uVar26)];
                      uVar26 = uVar26 + sVar6;
                    }
                    iVar19 = iVar19 + (int)uVar25;
                    uVar23 = uVar23 + sVar7;
                  }
                  uVar20 = uVar20 + sVar8;
                }
                uVar15 = uVar15 + sVar9;
              }
              return;
            }
            pcVar22 = "false";
            uVar16 = 0x10e4;
          }
        }
        else {
          pcVar22 = "ggml_nelements(dst) == ggml_nelements(src0)";
          uVar16 = 0x1087;
        }
      }
      else {
        pcVar22 = "ggml_is_contiguous(dst)";
        uVar16 = 0x1086;
      }
    }
    else {
      pcVar22 = "params->ith == 0";
      uVar16 = 0x1085;
    }
    break;
  case GGML_TYPE_F32:
    if (params->ith == 0) {
      _Var11 = ggml_is_contiguous(dst);
      if (_Var11) {
        iVar19 = dst->ne[1] * dst->ne[0] * dst->ne[2] * dst->ne[3];
        uVar1 = src0->ne[0];
        uVar2 = src0->ne[1];
        uVar12 = (ulong)uVar2;
        uVar3 = src0->ne[2];
        uVar4 = src0->ne[3];
        uVar13 = (ulong)uVar4;
        if (iVar19 == uVar3 * uVar4 * uVar2 * uVar1) {
          if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
            return;
          }
          sVar6 = src0->nb[0];
          sVar7 = src0->nb[1];
          sVar8 = src0->nb[2];
          sVar9 = src0->nb[3];
          _Var11 = ggml_is_contiguous(src0);
          gVar5 = dst->type;
          if (_Var11 && gVar5 == GGML_TYPE_F32) {
            sStack_90 = 2;
            goto LAB_00124309;
          }
          if (sVar6 == 4) {
            if (gVar5 == GGML_TYPE_F16) {
              uVar15 = 0;
              uVar27 = (ulong)uVar1;
              if ((int)uVar1 < 1) {
                uVar27 = uVar15;
              }
              if ((int)uVar2 < 1) {
                uVar12 = uVar15;
              }
              uVar14 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar14 = uVar15;
              }
              if ((int)uVar4 < 1) {
                uVar13 = uVar15;
              }
              for (uVar17 = 0; uVar17 != uVar13; uVar17 = uVar17 + 1) {
                uVar20 = uVar15;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  uVar23 = uVar20;
                  for (uVar24 = 0; uVar24 != uVar12; uVar24 = uVar24 + 1) {
                    for (uVar26 = 0; uVar27 != uVar26; uVar26 = uVar26 + 1) {
                      auVar32 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)src0->data +
                                                                uVar26 * 4 + uVar23)),0);
                      vpextrw_avx(auVar32,0);
                    }
                    uVar23 = uVar23 + sVar7;
                  }
                  uVar20 = uVar20 + sVar8;
                }
                uVar15 = uVar15 + sVar9;
              }
              return;
            }
            if (gVar5 == GGML_TYPE_F32) {
              sVar30 = (long)(int)uVar1 * 4;
              if ((int)uVar2 < 1) {
                uVar12 = 0;
              }
              uVar27 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar27 = 0;
              }
              local_50 = 0;
              if ((int)uVar4 < 1) {
                uVar13 = 0;
              }
              iVar19 = 0;
              for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
                lVar29 = local_50;
                for (uVar14 = 0; uVar14 != uVar27; uVar14 = uVar14 + 1) {
                  lVar18 = (long)iVar19 * sVar30;
                  lVar28 = lVar29;
                  for (lVar31 = 0; -lVar31 != uVar12; lVar31 = lVar31 + -1) {
                    memcpy((void *)((long)dst->data + lVar18),(void *)((long)src0->data + lVar28),
                           sVar30);
                    lVar18 = lVar18 + sVar30;
                    lVar28 = lVar28 + sVar7;
                  }
                  iVar19 = iVar19 - (int)lVar31;
                  lVar29 = lVar29 + sVar8;
                }
                local_50 = local_50 + sVar9;
              }
              return;
            }
            pcVar22 = "false";
            uVar16 = 0x1126;
          }
          else {
            if (gVar5 == GGML_TYPE_F16) {
              uVar15 = 0;
              uVar27 = (ulong)uVar1;
              if ((int)uVar1 < 1) {
                uVar27 = uVar15;
              }
              if ((int)uVar2 < 1) {
                uVar12 = uVar15;
              }
              uVar14 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar14 = uVar15;
              }
              if ((int)uVar4 < 1) {
                uVar13 = uVar15;
              }
              for (uVar17 = 0; uVar17 != uVar13; uVar17 = uVar17 + 1) {
                uVar20 = uVar15;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  uVar23 = uVar20;
                  for (uVar24 = 0; uVar24 != uVar12; uVar24 = uVar24 + 1) {
                    uVar26 = uVar23;
                    for (uVar25 = 0; uVar27 != uVar25; uVar25 = uVar25 + 1) {
                      auVar32 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)src0->data + uVar26)),0);
                      vpextrw_avx(auVar32,0);
                      uVar26 = uVar26 + sVar6;
                    }
                    uVar23 = uVar23 + sVar7;
                  }
                  uVar20 = uVar20 + sVar8;
                }
                uVar15 = uVar15 + sVar9;
              }
              return;
            }
            if (gVar5 == GGML_TYPE_F32) {
              uVar15 = 0;
              uVar27 = (ulong)uVar1;
              if ((int)uVar1 < 1) {
                uVar27 = uVar15;
              }
              pvVar10 = dst->data;
              if ((int)uVar2 < 1) {
                uVar12 = uVar15;
              }
              uVar14 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar14 = uVar15;
              }
              if ((int)uVar4 < 1) {
                uVar13 = uVar15;
              }
              iVar19 = 0;
              for (uVar17 = 0; uVar17 != uVar13; uVar17 = uVar17 + 1) {
                uVar20 = uVar15;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  uVar23 = uVar20;
                  for (uVar24 = 0; uVar24 != uVar12; uVar24 = uVar24 + 1) {
                    uVar26 = uVar23;
                    for (uVar25 = 0; uVar27 != uVar25; uVar25 = uVar25 + 1) {
                      *(undefined4 *)((long)pvVar10 + uVar25 * 4 + (long)iVar19 * 4) =
                           *(undefined4 *)((long)src0->data + uVar26);
                      uVar26 = uVar26 + sVar6;
                    }
                    iVar19 = iVar19 + (int)uVar25;
                    uVar23 = uVar23 + sVar7;
                  }
                  uVar20 = uVar20 + sVar8;
                }
                uVar15 = uVar15 + sVar9;
              }
              return;
            }
            pcVar22 = "false";
            uVar16 = 0x114c;
          }
        }
        else {
          pcVar22 = "ggml_nelements(dst) == ggml_nelements(src0)";
          uVar16 = 0x10ef;
        }
      }
      else {
        pcVar22 = "ggml_is_contiguous(dst)";
        uVar16 = 0x10ee;
      }
    }
    else {
      pcVar22 = "params->ith == 0";
      uVar16 = 0x10ed;
    }
    break;
  default:
    return;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar16,
          pcVar22);
  abort();
}

Assistant:

static void ggml_compute_forward_dup(
        const struct ggml_compute_params * params,
        const struct ggml_tensor * src0,
        struct ggml_tensor * dst) {
    switch (src0->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_dup_f16(params, src0, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_dup_f32(params, src0, dst);
            } break;
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}